

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndMenuBar(void)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *window_00;
  ImGuiGroupData *pIVar4;
  ImRect IVar5;
  float local_34;
  ImGuiWindow *pIStack_20;
  ImGuiNavLayer layer;
  ImGuiWindow *nav_earliest_child;
  ImGuiContext *g;
  ImGuiWindow *window;
  
  window_00 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((window_00->SkipItems & 1U) == 0) {
    bVar3 = NavMoveRequestButNoResultYet();
    if ((bVar3) &&
       (((pIVar2->NavMoveDir == 0 || (pIVar2->NavMoveDir == 1)) &&
        ((pIVar2->NavWindow->Flags & 0x10000000U) != 0)))) {
      pIStack_20 = pIVar2->NavWindow;
      while( true ) {
        bVar3 = false;
        if (pIStack_20->ParentWindow != (ImGuiWindow *)0x0) {
          bVar3 = (pIStack_20->ParentWindow->Flags & 0x10000000U) != 0;
        }
        if (!bVar3) break;
        pIStack_20 = pIStack_20->ParentWindow;
      }
      if (((pIStack_20->ParentWindow == window_00) && ((pIStack_20->DC).ParentLayoutType == 0)) &&
         (pIVar2->NavMoveRequestForward == ImGuiNavForward_None)) {
        if (((window_00->DC).NavLayerActiveMaskNext & 2U) == 0) {
          __assert_fail("window->DC.NavLayerActiveMaskNext & (1 << layer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                        ,0x1983,"void ImGui::EndMenuBar()");
        }
        FocusWindow(window_00);
        SetNavIDWithRectRel(window_00->NavLastIds[1],1,0,window_00->NavRectRel + 1);
        pIVar2->NavLayer = ImGuiNavLayer_Menu;
        pIVar2->NavDisableHighlight = true;
        pIVar2->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
        NavMoveRequestCancel();
      }
    }
    if ((window_00->Flags & 0x400U) == 0) {
      __assert_fail("window->Flags & ImGuiWindowFlags_MenuBar",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0x198d,"void ImGui::EndMenuBar()");
    }
    if (((window_00->DC).MenuBarAppending & 1U) == 0) {
      __assert_fail("window->DC.MenuBarAppending",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                    ,0x198e,"void ImGui::EndMenuBar()");
    }
    PopClipRect();
    PopID();
    fVar1 = (window_00->DC).CursorPos.x;
    IVar5 = ImGuiWindow::MenuBarRect(window_00);
    local_34 = IVar5.Min.x;
    (window_00->DC).MenuBarOffset.x = fVar1 - local_34;
    pIVar4 = ImVector<ImGuiGroupData>::back(&pIVar2->GroupStack);
    pIVar4->EmitItem = false;
    EndGroup();
    (window_00->DC).LayoutType = 1;
    (window_00->DC).NavLayerCurrent = ImGuiNavLayer_Main;
    (window_00->DC).MenuBarAppending = false;
  }
  return;
}

Assistant:

void ImGui::EndMenuBar()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;
    ImGuiContext& g = *GImGui;

    // Nav: When a move request within one of our child menu failed, capture the request to navigate among our siblings.
    if (NavMoveRequestButNoResultYet() && (g.NavMoveDir == ImGuiDir_Left || g.NavMoveDir == ImGuiDir_Right) && (g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
    {
        ImGuiWindow* nav_earliest_child = g.NavWindow;
        while (nav_earliest_child->ParentWindow && (nav_earliest_child->ParentWindow->Flags & ImGuiWindowFlags_ChildMenu))
            nav_earliest_child = nav_earliest_child->ParentWindow;
        if (nav_earliest_child->ParentWindow == window && nav_earliest_child->DC.ParentLayoutType == ImGuiLayoutType_Horizontal && g.NavMoveRequestForward == ImGuiNavForward_None)
        {
            // To do so we claim focus back, restore NavId and then process the movement request for yet another frame.
            // This involve a one-frame delay which isn't very problematic in this situation. We could remove it by scoring in advance for multiple window (probably not worth the hassle/cost)
            const ImGuiNavLayer layer = ImGuiNavLayer_Menu;
            IM_ASSERT(window->DC.NavLayerActiveMaskNext & (1 << layer)); // Sanity check
            FocusWindow(window);
            SetNavIDWithRectRel(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
            g.NavLayer = layer;
            g.NavDisableHighlight = true; // Hide highlight for the current frame so we don't see the intermediary selection.
            g.NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
            NavMoveRequestCancel();
        }
    }

    IM_ASSERT(window->Flags & ImGuiWindowFlags_MenuBar);
    IM_ASSERT(window->DC.MenuBarAppending);
    PopClipRect();
    PopID();
    window->DC.MenuBarOffset.x = window->DC.CursorPos.x - window->MenuBarRect().Min.x; // Save horizontal position so next append can reuse it. This is kinda equivalent to a per-layer CursorPos.
    g.GroupStack.back().EmitItem = false;
    EndGroup(); // Restore position on layer 0
    window->DC.LayoutType = ImGuiLayoutType_Vertical;
    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;
    window->DC.MenuBarAppending = false;
}